

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O1

string_view wabt::GetBasename(string_view filename)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type in_RSI;
  char *in_RDI;
  string_view sVar4;
  string_view local_20;
  
  local_20.data_ = in_RDI;
  local_20.size_ = in_RSI;
  sVar1 = string_view::find_last_of(&local_20,'/',0xffffffffffffffff);
  sVar2 = string_view::find_last_of(&local_20,'\\',0xffffffffffffffff);
  if ((sVar2 & sVar1) == 0xffffffffffffffff) {
LAB_002280e3:
    sVar4.size_ = local_20.size_;
    sVar4.data_ = local_20.data_;
  }
  else {
    if (sVar1 == 0xffffffffffffffff) {
      sVar3 = sVar2;
      if (sVar2 == 0xffffffffffffffff) goto LAB_002280e3;
    }
    else {
      sVar3 = sVar1;
      if ((sVar2 != 0xffffffffffffffff) && (sVar3 = sVar2, sVar2 < sVar1)) {
        sVar3 = sVar1;
      }
    }
    sVar4 = string_view::substr(&local_20,sVar3 + 1,0xffffffffffffffff);
  }
  return sVar4;
}

Assistant:

string_view GetBasename(string_view filename) {
  size_t last_slash = filename.find_last_of('/');
  size_t last_backslash = filename.find_last_of('\\');
  if (last_slash == string_view::npos && last_backslash == string_view::npos) {
    return filename;
  }

  if (last_slash == string_view::npos) {
    if (last_backslash == string_view::npos) {
      return filename;
    }
    last_slash = last_backslash;
  } else if (last_backslash != string_view::npos) {
    last_slash = std::max(last_slash, last_backslash);
  }

  return filename.substr(last_slash + 1);
}